

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::
         StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ::convert(string *str)

{
  bool bVar1;
  uint uVar2;
  IContext *pIVar3;
  element_type *peVar4;
  reference pcVar5;
  string *in_RDI;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *s;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  allocator<char> local_3e;
  undefined1 local_3d;
  string local_30 [48];
  
  pIVar3 = getCurrentContext();
  (*pIVar3->_vptr_IContext[4])();
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1395aa);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[10])();
  if ((uVar2 & 1) == 0) {
    std::operator+((char)((ulong)in_stack_ffffffffffffffa8 >> 0x38),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    std::operator+(in_stack_ffffffffffffff78,(char)((uint)in_stack_ffffffffffffff74 >> 0x18));
    std::__cxx11::string::~string(local_30);
  }
  else {
    local_3d = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    std::allocator<char>::~allocator(&local_3e);
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff68), bVar1) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&stack0xffffffffffffffb0);
      in_stack_ffffffffffffff74 = (int)*pcVar5;
      if (in_stack_ffffffffffffff74 == 9) {
        std::__cxx11::string::append((char *)in_RDI);
      }
      else if (in_stack_ffffffffffffff74 == 10) {
        std::__cxx11::string::append((char *)in_RDI);
      }
      else {
        std::__cxx11::string::push_back((char)in_RDI);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffffb0);
    }
    std::__cxx11::string::append((char *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string StringMaker<std::string>::convert(const std::string& str) {
    if (!getCurrentContext().getConfig()->showInvisibles()) {
        return '"' + str + '"';
    }

    std::string s("\"");
    for (char c : str) {
        switch (c) {
        case '\n':
            s.append("\\n");
            break;
        case '\t':
            s.append("\\t");
            break;
        default:
            s.push_back(c);
            break;
        }
    }
    s.append("\"");
    return s;
}